

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.cpp
# Opt level: O3

stbi__uint16 * stbi__convert_format16(stbi__uint16 *data,int img_n,int req_comp,uint x,uint y)

{
  int iVar1;
  ushort uVar2;
  stbi__uint16 sVar3;
  int iVar4;
  stbi__uint16 *psVar5;
  stbi__uint16 *psVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ushort *puVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  undefined1 auVar13 [16];
  
  psVar5 = data;
  if (req_comp != img_n) {
    psVar5 = (stbi__uint16 *)malloc((ulong)(req_comp * x * y * 2));
    if (psVar5 == (stbi__uint16 *)0x0) {
      free(data);
      *(char **)(in_FS_OFFSET + -0x10) = "outofmem";
      psVar5 = (stbi__uint16 *)0x0;
    }
    else {
      if (0 < (int)y) {
        iVar4 = req_comp + img_n * 8;
        iVar1 = x - 1;
        uVar10 = 0;
        uVar12 = 0;
        uVar8 = 0;
        do {
          if (iVar4 - 10U < 0x1a) {
            iVar7 = (int)uVar8 * x;
            puVar11 = data + (uint)(iVar7 * img_n);
            switch(iVar4) {
            case 10:
              if (-1 < iVar1) {
                lVar9 = 0;
                do {
                  psVar5[uVar10 + lVar9 * 2] = data[uVar12 + lVar9];
                  psVar5[uVar10 + lVar9 * 2 + 1] = 0xffff;
                  lVar9 = lVar9 + 1;
                } while (x != (uint)lVar9);
              }
              break;
            case 0xb:
              if (-1 < iVar1) {
                psVar6 = psVar5 + uVar10 + 2;
                lVar9 = 0;
                do {
                  sVar3 = data[uVar12 + lVar9];
                  *psVar6 = sVar3;
                  psVar6[-1] = sVar3;
                  psVar6[-2] = sVar3;
                  lVar9 = lVar9 + 1;
                  psVar6 = psVar6 + 3;
                } while (x != (uint)lVar9);
              }
              break;
            case 0xc:
              if (-1 < iVar1) {
                lVar9 = 0;
                do {
                  auVar13._8_8_ = 0;
                  auVar13._0_8_ = (ulong)data[uVar12 + lVar9] | 0xffff0000;
                  auVar13 = pshuflw(auVar13,auVar13,0x40);
                  *(long *)(psVar5 + uVar10 + lVar9 * 4) = auVar13._0_8_;
                  lVar9 = lVar9 + 1;
                } while (x != (uint)lVar9);
              }
              break;
            case 0x11:
              if (-1 < iVar1) {
                lVar9 = 0;
                do {
                  psVar5[uVar10 + lVar9] = data[uVar12 + lVar9 * 2];
                  lVar9 = lVar9 + 1;
                } while (x != (uint)lVar9);
              }
              break;
            case 0x13:
              if (-1 < iVar1) {
                psVar6 = psVar5 + uVar10 + 2;
                lVar9 = 0;
                do {
                  sVar3 = data[uVar12 + lVar9 * 2];
                  *psVar6 = sVar3;
                  psVar6[-1] = sVar3;
                  psVar6[-2] = sVar3;
                  lVar9 = lVar9 + 1;
                  psVar6 = psVar6 + 3;
                } while (x != (uint)lVar9);
              }
              break;
            case 0x14:
              if (-1 < iVar1) {
                lVar9 = 0;
                do {
                  auVar13 = pshuflw(ZEXT416(*(uint *)(data + uVar12 + lVar9 * 2)),
                                    ZEXT416(*(uint *)(data + uVar12 + lVar9 * 2)),0x40);
                  *(long *)(psVar5 + uVar10 + lVar9 * 4) = auVar13._0_8_;
                  lVar9 = lVar9 + 1;
                } while (x != (uint)lVar9);
              }
              break;
            case 0x19:
              if (-1 < iVar1) {
                lVar9 = 0;
                do {
                  uVar2 = puVar11[2];
                  psVar5[uVar10 + lVar9] =
                       (stbi__uint16)
                       ((uint)uVar2 * 2 + ((uint)uVar2 + (uint)uVar2 * 8) * 3 +
                        (uint)puVar11[1] * 0x96 + (uint)*puVar11 * 0x4d >> 8);
                  lVar9 = lVar9 + 1;
                  puVar11 = puVar11 + 3;
                } while (x != (uint)lVar9);
              }
              break;
            case 0x1a:
              if (-1 < iVar1) {
                lVar9 = 0;
                do {
                  uVar2 = puVar11[2];
                  psVar5[uVar10 + lVar9 * 2] =
                       (stbi__uint16)
                       ((uint)uVar2 * 2 + ((uint)uVar2 + (uint)uVar2 * 8) * 3 +
                        (uint)puVar11[1] * 0x96 + (uint)*puVar11 * 0x4d >> 8);
                  psVar5[uVar10 + lVar9 * 2 + 1] = 0xffff;
                  lVar9 = lVar9 + 1;
                  puVar11 = puVar11 + 3;
                } while (x != (uint)lVar9);
              }
              break;
            case 0x1c:
              if (-1 < iVar1) {
                lVar9 = 0;
                do {
                  *(undefined4 *)(psVar5 + uVar10 + lVar9 * 4) = *(undefined4 *)puVar11;
                  psVar5[uVar10 + lVar9 * 4 + 2] = puVar11[2];
                  psVar5[uVar10 + lVar9 * 4 + 3] = 0xffff;
                  lVar9 = lVar9 + 1;
                  puVar11 = puVar11 + 3;
                } while (x != (uint)lVar9);
              }
              break;
            case 0x21:
              if (-1 < iVar1) {
                lVar9 = 0;
                do {
                  uVar2 = data[uVar12 + lVar9 * 4 + 2];
                  psVar5[uVar10 + lVar9] =
                       (stbi__uint16)
                       ((uint)uVar2 * 2 + ((uint)uVar2 + (uint)uVar2 * 8) * 3 +
                        (uint)data[uVar12 + lVar9 * 4 + 1] * 0x96 +
                        (uint)data[uVar12 + lVar9 * 4] * 0x4d >> 8);
                  lVar9 = lVar9 + 1;
                } while (x != (uint)lVar9);
              }
              break;
            case 0x22:
              if (-1 < iVar1) {
                lVar9 = 0;
                do {
                  uVar2 = data[uVar12 + lVar9 * 4 + 2];
                  psVar5[uVar10 + lVar9 * 2] =
                       (stbi__uint16)
                       ((uint)uVar2 * 2 + ((uint)uVar2 + (uint)uVar2 * 8) * 3 +
                        (uint)data[uVar12 + lVar9 * 4 + 1] * 0x96 +
                        (uint)data[uVar12 + lVar9 * 4] * 0x4d >> 8);
                  psVar5[uVar10 + lVar9 * 2 + 1] = data[uVar12 + lVar9 * 4 + 3];
                  lVar9 = lVar9 + 1;
                } while (x != (uint)lVar9);
              }
              break;
            case 0x23:
              if (-1 < iVar1) {
                psVar6 = psVar5 + (uint)(iVar7 * req_comp);
                lVar9 = 0;
                do {
                  *(undefined4 *)psVar6 = *(undefined4 *)(data + uVar12 + lVar9 * 4);
                  psVar6[2] = data[uVar12 + lVar9 * 4 + 2];
                  lVar9 = lVar9 + 1;
                  psVar6 = psVar6 + 3;
                } while (x != (uint)lVar9);
              }
            }
          }
          uVar8 = uVar8 + 1;
          uVar12 = (ulong)((int)uVar12 + x * img_n);
          uVar10 = (ulong)((int)uVar10 + req_comp * x);
        } while (uVar8 != y);
      }
      free(data);
    }
  }
  return psVar5;
}

Assistant:

static stbi__uint16 *stbi__convert_format16(stbi__uint16 *data, int img_n, int req_comp, unsigned int x, unsigned int y)
{
   int i,j;
   stbi__uint16 *good;

   if (req_comp == img_n) return data;
   STBI_ASSERT(req_comp >= 1 && req_comp <= 4);

   good = (stbi__uint16 *) stbi__malloc(req_comp * x * y * 2);
   if (good == NULL) {
      STBI_FREE(data);
      return (stbi__uint16 *) stbi__errpuc("outofmem", "Out of memory");
   }

   for (j=0; j < (int) y; ++j) {
      stbi__uint16 *src  = data + j * x * img_n   ;
      stbi__uint16 *dest = good + j * x * req_comp;

      #define STBI__COMBO(a,b)  ((a)*8+(b))
      #define STBI__CASE(a,b)   case STBI__COMBO(a,b): for(i=x-1; i >= 0; --i, src += a, dest += b)
      // convert source image with img_n components to one with req_comp components;
      // avoid switch per pixel, so use switch per scanline and massive macros
      switch (STBI__COMBO(img_n, req_comp)) {
         STBI__CASE(1,2) { dest[0]=src[0]; dest[1]=0xffff;                                     } break;
         STBI__CASE(1,3) { dest[0]=dest[1]=dest[2]=src[0];                                     } break;
         STBI__CASE(1,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=0xffff;                     } break;
         STBI__CASE(2,1) { dest[0]=src[0];                                                     } break;
         STBI__CASE(2,3) { dest[0]=dest[1]=dest[2]=src[0];                                     } break;
         STBI__CASE(2,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=src[1];                     } break;
         STBI__CASE(3,4) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];dest[3]=0xffff;        } break;
         STBI__CASE(3,1) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]);                   } break;
         STBI__CASE(3,2) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]); dest[1] = 0xffff; } break;
         STBI__CASE(4,1) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]);                   } break;
         STBI__CASE(4,2) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]); dest[1] = src[3]; } break;
         STBI__CASE(4,3) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];                       } break;
         default: STBI_ASSERT(0);
      }
      #undef STBI__CASE
   }

   STBI_FREE(data);
   return good;
}